

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2furthest_edge_query.cc
# Opt level: O2

void __thiscall
S2FurthestEdgeQuery::FindFurthestEdges
          (S2FurthestEdgeQuery *this,Target *target,
          vector<S2FurthestEdgeQuery::Result,_std::allocator<S2FurthestEdgeQuery::Result>_> *results
          )

{
  pointer pRVar1;
  Result local_48;
  _Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
  local_38;
  
  if (*(long *)(results + 8) != *(long *)results) {
    *(long *)(results + 8) = *(long *)results;
  }
  S2ClosestEdgeQueryBase<S2MaxDistance>::FindClosestEdges
            ((vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
              *)&local_38,&this->base_,target,(Options *)this);
  for (pRVar1 = local_38._M_impl.super__Vector_impl_data._M_start;
      pRVar1 != local_38._M_impl.super__Vector_impl_data._M_finish; pRVar1 = pRVar1 + 1) {
    local_48.distance_.length2_ = (pRVar1->distance_).distance_.length2_;
    local_48.shape_id_ = pRVar1->shape_id_;
    local_48.edge_id_ = pRVar1->edge_id_;
    std::vector<S2FurthestEdgeQuery::Result,_std::allocator<S2FurthestEdgeQuery::Result>_>::
    emplace_back<S2FurthestEdgeQuery::Result>(results,&local_48);
  }
  std::
  _Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

void S2FurthestEdgeQuery::FindFurthestEdges(
    Target* target, std::vector<S2FurthestEdgeQuery::Result>* results) {
  results->clear();
  for (auto result : base_.FindClosestEdges(target, options_)) {
    results->push_back(S2FurthestEdgeQuery::Result(result));
  }
}